

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

void load_levels_example(void)

{
  string sStack_28;
  
  spdlog::details::os::getenv_abi_cxx11_((os *)&sStack_28,"SPDLOG_LEVEL");
  if (sStack_28._M_string_length != 0) {
    spdlog::cfg::helpers::load_levels(&sStack_28);
  }
  std::__cxx11::string::~string((string *)&sStack_28);
  return;
}

Assistant:

void load_levels_example()
{
    // Set the log level to "info" and mylogger to "trace":
    // SPDLOG_LEVEL=info,mylogger=trace && ./example
    spdlog::cfg::load_env_levels();
    // or from command line:
    // ./example SPDLOG_LEVEL=info,mylogger=trace
    // #include "spdlog/cfg/argv.h" // for loading levels from argv
    // spdlog::cfg::load_argv_levels(args, argv);
}